

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O0

int read_single_rle_entry
              (Dwarf_Debug dbg,Dwarf_Small *data,Dwarf_Unsigned dataoffset,Dwarf_Small *enddata,
              uint address_size,uint *bytes_count_out,uint *entry_kind,
              Dwarf_Unsigned *entry_operand1,Dwarf_Unsigned *entry_operand2,Dwarf_Error *error)

{
  unsigned_long uVar1;
  Dwarf_Small *dbg_00;
  Dwarf_Unsigned DVar2;
  char *msg;
  Dwarf_Unsigned sectionsize;
  dwarfstring m;
  Dwarf_Small *pDStack_108;
  int lu_res_3;
  Dwarf_Unsigned lu_local_3;
  Dwarf_Unsigned lu_leblen_3;
  Dwarf_Byte_Ptr readend_3;
  Dwarf_Unsigned _ltmp_3;
  Dwarf_Byte_Ptr readend_2;
  Dwarf_Unsigned _ltmp_2;
  Dwarf_Byte_Ptr readend_1;
  Dwarf_Unsigned _ltmp_1;
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  Dwarf_Small *pDStack_b0;
  int lu_res_2;
  Dwarf_Unsigned lu_local_2;
  Dwarf_Unsigned lu_leblen_2;
  Dwarf_Unsigned DStack_98;
  int lu_res_1;
  Dwarf_Unsigned lu_local_1;
  Dwarf_Unsigned lu_leblen_1;
  Dwarf_Unsigned DStack_80;
  int lu_res;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Small *startdata;
  Dwarf_Unsigned val2;
  Dwarf_Unsigned val1;
  Dwarf_Unsigned DStack_50;
  uint code;
  Dwarf_Unsigned leblen;
  Dwarf_Unsigned count;
  uint *bytes_count_out_local;
  Dwarf_Small *pDStack_30;
  uint address_size_local;
  Dwarf_Small *enddata_local;
  Dwarf_Unsigned dataoffset_local;
  Dwarf_Small *data_local;
  Dwarf_Debug dbg_local;
  
  leblen = 0;
  DStack_50 = 0;
  val1._4_4_ = 0;
  val2 = 0;
  startdata = (Dwarf_Small *)0x0;
  lu_leblen = 0;
  count = (Dwarf_Unsigned)bytes_count_out;
  bytes_count_out_local._4_4_ = address_size;
  pDStack_30 = enddata;
  enddata_local = (Dwarf_Small *)dataoffset;
  data_local = (Dwarf_Small *)dbg;
  if (data < enddata) {
    val1._4_4_ = (uint)*data;
    dataoffset_local = (Dwarf_Unsigned)(data + 1);
    DVar2 = 1;
    leblen = 1;
    uVar1 = (unsigned_long)address_size;
    lu_leblen = (Dwarf_Unsigned)data;
    switch(val1._4_4_) {
    case 0:
      break;
    case 1:
      lu_local = 0;
      DStack_80 = 0;
      lu_leblen_1._4_4_ = 0;
      leblen = DVar2;
      lu_leblen_1._4_4_ =
           dwarf_decode_leb128((char *)dataoffset_local,&lu_local,&stack0xffffffffffffff80,
                               (char *)enddata);
      if (lu_leblen_1._4_4_ == 1) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        return 1;
      }
      val2 = DStack_80;
      dataoffset_local = lu_local + dataoffset_local;
      DStack_50 = lu_local;
      leblen = lu_local + leblen;
      break;
    case 2:
    case 3:
    case 4:
      lu_local_1 = 0;
      DStack_98 = 0;
      lu_leblen_2._4_4_ = 0;
      leblen = DVar2;
      lu_leblen_2._4_4_ =
           dwarf_decode_leb128((char *)dataoffset_local,&lu_local_1,&stack0xffffffffffffff68,
                               (char *)enddata);
      if (lu_leblen_2._4_4_ == 1) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        return 1;
      }
      val2 = DStack_98;
      dataoffset_local = lu_local_1 + dataoffset_local;
      DStack_50 = lu_local_1;
      leblen = lu_local_1 + leblen;
      lu_local_2 = 0;
      pDStack_b0 = (Dwarf_Small *)0x0;
      _ltmp._4_4_ = 0;
      _ltmp._4_4_ = dwarf_decode_leb128((char *)dataoffset_local,&lu_local_2,
                                        (Dwarf_Unsigned *)&stack0xffffffffffffff50,
                                        (char *)pDStack_30);
      if (_ltmp._4_4_ == 1) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        return 1;
      }
      startdata = pDStack_b0;
      dataoffset_local = lu_local_2 + dataoffset_local;
      DStack_50 = lu_local_2;
      leblen = lu_local_2 + leblen;
      break;
    case 5:
      readend = (Dwarf_Byte_Ptr)0x0;
      _ltmp_1 = dataoffset_local + address_size;
      if (_ltmp_1 < dataoffset_local) {
        leblen = DVar2;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (enddata < _ltmp_1) {
        leblen = DVar2;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      leblen = DVar2;
      (*dbg->de_copy_word)(&readend,(void *)dataoffset_local,uVar1);
      val2 = (Dwarf_Unsigned)readend;
      dataoffset_local = dataoffset_local + bytes_count_out_local._4_4_;
      leblen = bytes_count_out_local._4_4_ + leblen;
      break;
    case 6:
      readend_1 = (Dwarf_Byte_Ptr)0x0;
      _ltmp_2 = dataoffset_local + address_size;
      if (_ltmp_2 < dataoffset_local) {
        leblen = DVar2;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (enddata < _ltmp_2) {
        leblen = DVar2;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      leblen = DVar2;
      (*dbg->de_copy_word)(&readend_1,(void *)dataoffset_local,uVar1);
      val2 = (Dwarf_Unsigned)readend_1;
      dataoffset_local = dataoffset_local + bytes_count_out_local._4_4_;
      leblen = bytes_count_out_local._4_4_ + leblen;
      readend_2 = (Dwarf_Byte_Ptr)0x0;
      _ltmp_3 = dataoffset_local + bytes_count_out_local._4_4_;
      if (_ltmp_3 < dataoffset_local) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (pDStack_30 < _ltmp_3) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      (**(code **)(data_local + 0x1bf8))(&readend_2,dataoffset_local,bytes_count_out_local._4_4_);
      startdata = readend_2;
      dataoffset_local = dataoffset_local + bytes_count_out_local._4_4_;
      leblen = bytes_count_out_local._4_4_ + leblen;
      break;
    case 7:
      readend_3 = (Dwarf_Byte_Ptr)0x0;
      lu_leblen_3 = dataoffset_local + address_size;
      if (lu_leblen_3 < dataoffset_local) {
        leblen = DVar2;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (enddata < lu_leblen_3) {
        leblen = DVar2;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      leblen = DVar2;
      (*dbg->de_copy_word)(&readend_3,(void *)dataoffset_local,uVar1);
      val2 = (Dwarf_Unsigned)readend_3;
      dataoffset_local = dataoffset_local + bytes_count_out_local._4_4_;
      leblen = bytes_count_out_local._4_4_ + leblen;
      lu_local_3 = 0;
      pDStack_108 = (Dwarf_Small *)0x0;
      m._28_4_ = 0;
      m._28_4_ = dwarf_decode_leb128((char *)dataoffset_local,&lu_local_3,
                                     (Dwarf_Unsigned *)&stack0xfffffffffffffef8,(char *)pDStack_30);
      if (m._28_4_ == 1) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        return 1;
      }
      startdata = pDStack_108;
      dataoffset_local = lu_local_3 + dataoffset_local;
      DStack_50 = lu_local_3;
      leblen = lu_local_3 + leblen;
      break;
    default:
      leblen = DVar2;
      dwarfstring_constructor((dwarfstring_s *)&sectionsize);
      dwarfstring_append_printf_u
                ((dwarfstring *)&sectionsize,
                 "DW_DLE_RNGLISTS_ERROR: The rangelists entry at .debug_rnglists offset 0x%x",
                 (dwarfstring_u)enddata_local);
      dwarfstring_append_printf_u
                ((dwarfstring *)&sectionsize," has code 0x%x which is unknown",(ulong)val1._4_4_);
      dbg_00 = data_local;
      msg = dwarfstring_string((dwarfstring_s *)&sectionsize);
      _dwarf_error_string((Dwarf_Debug)dbg_00,error,0x1d4,msg);
      dwarfstring_destructor((dwarfstring_s *)&sectionsize);
      return 1;
    }
    if ((pDStack_30 < dataoffset_local) || (dataoffset_local < lu_leblen)) {
      _dwarf_error_string((Dwarf_Debug)data_local,error,0x1d4,
                          "DW_DLE_RNGLISTS_ERROR: The end of an rle entry is past the end of its allowed space"
                         );
      dbg_local._4_4_ = 1;
    }
    else if (*(ulong *)(data_local + 0xc30) < leblen) {
      _dwarf_error_string((Dwarf_Debug)data_local,error,0x1d4,
                          "DW_DLE_RNGLISTS_ERROR: The number of bytes in a single rnglist entry is too large to be reasonable"
                         );
      dbg_local._4_4_ = 1;
    }
    else {
      *(int *)count = (int)leblen;
      *entry_kind = val1._4_4_;
      *entry_operand1 = val2;
      *entry_operand2 = (Dwarf_Unsigned)startdata;
      dbg_local._4_4_ = 0;
    }
  }
  else {
    dataoffset_local = (Dwarf_Unsigned)data;
    _dwarf_error_string(dbg,error,0x1d4,
                        "DW_DLE_RNGLISTS_ERROR: An rle entry begins past the end of its allowed space. Corrupt DWARF."
                       );
    dbg_local._4_4_ = 1;
  }
  return dbg_local._4_4_;
}

Assistant:

static int
read_single_rle_entry(Dwarf_Debug dbg,
    Dwarf_Small   *data,
    Dwarf_Unsigned dataoffset,
    Dwarf_Small   *enddata,
    unsigned       address_size,
    unsigned       *bytes_count_out,
    unsigned       *entry_kind,
    Dwarf_Unsigned *entry_operand1,
    Dwarf_Unsigned *entry_operand2,
    Dwarf_Error* error)
{
    Dwarf_Unsigned count = 0;
    Dwarf_Unsigned leblen = 0;
    unsigned code = 0;
    Dwarf_Unsigned val1 = 0;
    Dwarf_Unsigned val2 = 0;
    Dwarf_Small *  startdata = 0;

    if (data >= enddata) {
        _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
            "DW_DLE_RNGLISTS_ERROR: "
            "An rle entry begins past the end of "
            "its allowed space. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    startdata = data;
    code = *data;
    ++data;
    ++count;
    switch(code) {
    case DW_RLE_end_of_list: break;
    case DW_RLE_base_addressx:{
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_RLE_startx_endx:
    case DW_RLE_startx_length:
    case DW_RLE_offset_pair: {
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_RLE_base_address: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_RLE_start_end: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        READ_UNALIGNED_CK(dbg,val2, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_RLE_start_length: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    default: {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_RNGLISTS_ERROR: "
            "The rangelists entry at .debug_rnglists"
            " offset 0x%x" ,dataoffset);
        dwarfstring_append_printf_u(&m,
            " has code 0x%x which is unknown",code);
        _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
        }
        break;
    }
    {
        /*  We want to avoid overflow in additions, and
            the overall section size is a reasonable check
            on count.  The sequence of tests is to
            preserve a testing baseline:
            baselines/hongg2024-02-18-m.base
            otherwise we would test against sectionsize first.*/

        Dwarf_Unsigned sectionsize = dbg->de_debug_rnglists.dss_size;

        if (data > enddata || data < startdata ) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
                "DW_DLE_RNGLISTS_ERROR: "
                "The end of an rle entry is past the end "
                "of its allowed space");
            return DW_DLV_ERROR;
        }
        if (count > sectionsize) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
                "DW_DLE_RNGLISTS_ERROR: "
                "The number of bytes in a single "
                "rnglist entry is "
                "too large to be reasonable");
            return DW_DLV_ERROR;
        }
    }

    *bytes_count_out = (unsigned int)count;
    *entry_kind = code;
    *entry_operand1 = val1;
    *entry_operand2 = val2;
    return DW_DLV_OK;
}